

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

string * __thiscall
pbrt::SobolSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,SobolSampler *this)

{
  RandomizeStrategy *unaff_RBX;
  
  StringPrintf<pbrt::Point2<int>const&,int_const&,int_const&,int_const&,long_const&,pbrt::RandomizeStrategy_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ SobolSampler pixel: %s dimension: %d samplesPerPixel: %d scale: %d sobolIndex: %d randomizeStrategy: %s ]"
             ,(char *)&this->pixel,(Point2<int> *)&this->dimension,&this->samplesPerPixel,
             &this->scale,(int *)&this->sobolIndex,(long *)&this->randomizeStrategy,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string SobolSampler::ToString() const {
    return StringPrintf("[ SobolSampler pixel: %s dimension: %d "
                        "samplesPerPixel: %d scale: %d sobolIndex: %d "
                        "randomizeStrategy: %s ]",
                        pixel, dimension, samplesPerPixel, scale, sobolIndex,
                        randomizeStrategy);
}